

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charMapper.cpp
# Opt level: O0

CharMapper<unsigned_char> * gmlc::utilities::base64Mapper(void)

{
  CharMapper<unsigned_char> *in_RDI;
  uchar indexChar_2;
  uchar indexChar_1;
  uchar indexChar;
  uchar val;
  uchar val_00;
  uchar defVal;
  CharMapper<unsigned_char> *this;
  undefined1 local_4;
  undefined1 local_3;
  undefined1 local_2;
  
  defVal = (uchar)((ulong)in_RDI >> 0x38);
  this = in_RDI;
  CharMapper<unsigned_char>::CharMapper(in_RDI,defVal);
  for (local_2 = 0x41; val_00 = (uchar)((ulong)in_RDI >> 0x30), local_2 < 0x5b;
      local_2 = local_2 + 1) {
    CharMapper<unsigned_char>::addKey(this,defVal,val_00);
  }
  for (local_3 = 0x61; local_3 < 0x7b; local_3 = local_3 + 1) {
    CharMapper<unsigned_char>::addKey(this,defVal,val_00);
  }
  for (local_4 = 0x30; local_4 < 0x3a; local_4 = local_4 + 1) {
    CharMapper<unsigned_char>::addKey(this,defVal,val_00);
  }
  CharMapper<unsigned_char>::addKey(this,defVal,val_00);
  CharMapper<unsigned_char>::addKey(this,defVal,val_00);
  return this;
}

Assistant:

CharMapper<unsigned char> base64Mapper()
{
    CharMapper<unsigned char> b64(0xFF);
    unsigned char val{0};
    for (unsigned char indexChar = 'A'; indexChar <= 'Z'; ++indexChar) {
        b64.addKey(indexChar, val);
        ++val;
    }
    for (unsigned char indexChar = 'a'; indexChar <= 'z'; ++indexChar) {
        b64.addKey(indexChar, val);
        ++val;
    }
    for (unsigned char indexChar = '0'; indexChar <= '9'; ++indexChar) {
        b64.addKey(indexChar, val);
        ++val;
    }
    b64.addKey('+', val++);
    b64.addKey('/', val);
    return b64;
}